

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O1

CameraSample *
pbrt::GetCameraSample<pbrt::SamplerHandle>
          (CameraSample *__return_storage_ptr__,SamplerHandle *sampler,Point2i *pPixel,
          FilterHandle *filter)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  byte bVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  short sVar5;
  undefined1 auVar6 [16];
  HaltonSampler *pHVar7;
  DebugMLTSampler *pDVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Float FVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar24 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar23 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar25 [64];
  FilterSample FVar27;
  DispatchSplit<5> local_69;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_40;
  TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 auVar26 [60];
  
  auVar26 = in_ZMM1._4_60_;
  uVar3 = (sampler->
          super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
          ).bits;
  sVar5 = (short)(uVar3 >> 0x30);
  local_58 = &pPixel->super_Tuple2<pbrt::Point2,_int>;
  if (uVar3 >> 0x30 < 5) {
    pHVar7 = (HaltonSampler *)(uVar3 & 0xffffffffffff);
    if (uVar3 < 0x3000000000000) {
      if (sVar5 == 2) {
        auVar14._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar7);
        auVar14._8_56_ = extraout_var_01;
      }
      else {
        auVar14._0_8_ = HaltonSampler::Get2D(pHVar7);
        auVar14._8_56_ = extraout_var_05;
      }
    }
    else if (sVar5 == 3) {
      auVar14._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar7);
      auVar14._8_56_ = extraout_var_03;
    }
    else {
      auVar14._0_8_ = RandomSampler::Get2D((RandomSampler *)pHVar7);
      auVar14._8_56_ = extraout_var_07;
    }
  }
  else {
    pDVar8 = (DebugMLTSampler *)(uVar3 & 0xffffffffffff);
    if (uVar3 < 0x7000000000000) {
      if (sVar5 == 6) {
        auVar14._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar8);
        auVar14._8_56_ = extraout_var_02;
      }
      else {
        auVar14._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar8);
        auVar14._8_56_ = extraout_var_06;
      }
    }
    else if (sVar5 == 7) {
      auVar14._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar8);
      auVar14._8_56_ = extraout_var_04;
    }
    else {
      local_68._0_4_ = DebugMLTSampler::Get1D(pDVar8);
      local_68._4_4_ = extraout_XMM0_Db;
      local_68._8_4_ = extraout_XMM0_Dc;
      local_68._12_4_ = extraout_XMM0_Dd;
      auVar13._0_4_ = DebugMLTSampler::Get1D(pDVar8);
      auVar13._4_60_ = extraout_var;
      auVar26 = ZEXT1260(local_68._4_12_);
      auVar9 = vinsertps_avx(local_68,auVar13._0_16_,0x10);
      auVar14 = ZEXT1664(auVar9);
    }
  }
  auVar24 = auVar14._8_56_;
  local_40 = vmovlps_avx(auVar14._0_16_);
  local_38.bits =
       (filter->
       super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
       ).bits;
  FVar27 = detail::DispatchSplit<5>::operator()(&local_69,&local_40,&local_38,local_38.bits >> 0x30)
  ;
  auVar25._0_4_ = FVar27.weight;
  auVar25._4_60_ = auVar26;
  auVar15._0_8_ = FVar27.p.super_Tuple2<pbrt::Point2,_float>;
  auVar15._8_56_ = auVar24;
  local_68 = auVar25._0_16_;
  bVar2 = *(byte *)(Options + 0xc);
  auVar9._0_12_ = ZEXT412(0);
  auVar9._12_4_ = 0;
  if (bVar2 == 0) {
    auVar9 = auVar15._0_16_;
  }
  (__return_storage_ptr__->pFilm).super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0x0;
  (__return_storage_ptr__->pLens).super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0x0;
  __return_storage_ptr__->time = 0.0;
  __return_storage_ptr__->weight = 1.0;
  auVar11._8_8_ = 0;
  auVar11._0_4_ = local_58->x;
  auVar11._4_4_ = local_58->y;
  auVar4 = vcvtdq2ps_avx(auVar11);
  auVar12._0_4_ = auVar9._0_4_ + auVar4._0_4_;
  auVar12._4_4_ = auVar9._4_4_ + auVar4._4_4_;
  auVar12._8_4_ = auVar9._8_4_ + auVar4._8_4_;
  auVar12._12_4_ = auVar9._12_4_ + auVar4._12_4_;
  auVar4._8_4_ = 0x3f000000;
  auVar4._0_8_ = 0x3f0000003f000000;
  auVar4._12_4_ = 0x3f000000;
  auVar9 = vaddps_avx512vl(auVar12,auVar4);
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar9);
  (__return_storage_ptr__->pFilm).super_Tuple2<pbrt::Point2,_float> = TVar1;
  local_38.bits =
       (sampler->
       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  FVar10 = detail::DispatchSplit<8>::operator()
                     ((DispatchSplit<8> *)&local_40,&local_38,local_38.bits >> 0x30);
  __return_storage_ptr__->time = FVar10;
  uVar3 = (sampler->
          super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
          ).bits;
  sVar5 = (short)(uVar3 >> 0x30);
  if (uVar3 < 0x5000000000000) {
    pHVar7 = (HaltonSampler *)(uVar3 & 0xffffffffffff);
    if (uVar3 < 0x3000000000000) {
      if (sVar5 == 2) {
        auVar16._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar7);
        auVar16._8_56_ = extraout_var_08;
        auVar9 = auVar16._0_16_;
      }
      else {
        auVar20._0_8_ = HaltonSampler::Get2D(pHVar7);
        auVar20._8_56_ = extraout_var_12;
        auVar9 = auVar20._0_16_;
      }
    }
    else if (sVar5 == 3) {
      auVar18._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar7);
      auVar18._8_56_ = extraout_var_10;
      auVar9 = auVar18._0_16_;
    }
    else {
      auVar22._0_8_ = RandomSampler::Get2D((RandomSampler *)pHVar7);
      auVar22._8_56_ = extraout_var_14;
      auVar9 = auVar22._0_16_;
    }
  }
  else {
    pDVar8 = (DebugMLTSampler *)(uVar3 & 0xffffffffffff);
    if (uVar3 < 0x7000000000000) {
      if (sVar5 == 6) {
        auVar17._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar8);
        auVar17._8_56_ = extraout_var_09;
        auVar9 = auVar17._0_16_;
      }
      else {
        auVar21._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar8);
        auVar21._8_56_ = extraout_var_13;
        auVar9 = auVar21._0_16_;
      }
    }
    else if (sVar5 == 7) {
      auVar19._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar8);
      auVar19._8_56_ = extraout_var_11;
      auVar9 = auVar19._0_16_;
    }
    else {
      FVar10 = DebugMLTSampler::Get1D(pDVar8);
      local_58._0_4_ = FVar10;
      local_58._4_4_ = extraout_XMM0_Db_00;
      uStack_50 = extraout_XMM0_Dc_00;
      uStack_4c = extraout_XMM0_Dd_00;
      auVar23._0_4_ = DebugMLTSampler::Get1D(pDVar8);
      auVar23._4_60_ = extraout_var_00;
      auVar6._4_4_ = local_58._4_4_;
      auVar6._0_4_ = (Float)local_58;
      auVar6._8_4_ = uStack_50;
      auVar6._12_4_ = uStack_4c;
      auVar9 = vinsertps_avx(auVar6,auVar23._0_16_,0x10);
    }
  }
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar9);
  (__return_storage_ptr__->pLens).super_Tuple2<pbrt::Point2,_float> = TVar1;
  __return_storage_ptr__->weight =
       (Float)((uint)(bVar2 & 1) * 0x3f800000 + (uint)!(bool)(bVar2 & 1) * local_68._0_4_);
  return __return_storage_ptr__;
}

Assistant:

inline PBRT_CPU_GPU CameraSample GetCameraSample(Sampler sampler, const Point2i &pPixel,
                                                 FilterHandle filter) {
    FilterSample fs = filter.Sample(sampler.Get2D());
    if (GetOptions().disablePixelJitter) {
        fs.p = Point2f(0, 0);
        fs.weight = 1;
    }

    CameraSample cs;
    cs.pFilm = pPixel + fs.p + Vector2f(0.5, 0.5);
    cs.time = sampler.Get1D();
    cs.pLens = sampler.Get2D();
    cs.weight = fs.weight;
    return cs;
}